

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isotpsend.c
# Opt level: O1

void print_usage(char *prg)

{
  fprintf(_stderr,"\nUsage: %s [options] <CAN interface>\n",prg);
  fwrite("Options:\n",9,1,_stderr);
  fwrite("         -s <can_id>  (source can_id. Use 8 digits for extended IDs)\n",0x45,1,_stderr);
  fwrite("         -d <can_id>  (destination can_id. Use 8 digits for extended IDs)\n",0x4a,1,
         _stderr);
  fwrite("         -x <addr>[:<rxaddr>]  (extended addressing / opt. separate rxaddr)\n",0x4c,1,
         _stderr);
  fwrite("         -p [tx]:[rx]  (set and enable tx/rx padding bytes)\n",0x3c,1,_stderr);
  fwrite("         -P <mode>     (check rx padding for (l)ength (c)ontent (a)ll)\n",0x47,1,_stderr);
  fwrite("         -t <time ns>  (frame transmit time (N_As) in nanosecs) (*)\n",0x44,1,_stderr);
  fwrite("         -f <time ns>  (ignore FC and force local tx stmin value in nanosecs)\n",0x4e,1,
         _stderr);
  fwrite("         -D <len>      (send a fixed PDU with len bytes - no STDIN data)\n",0x49,1,_stderr
        );
  fwrite("         -l <num>      (send num PDUs - use \'i\' for infinite loop)\n",0x43,1,_stderr);
  fwrite("         -g <usecs>    (wait given usecs before sending a PDU)\n",0x3f,1,_stderr);
  fwrite("         -b            (block until the PDU transmission is completed)\n",0x47,1,_stderr);
  fwrite("         -S            (SF broadcast mode - for functional addressing)\n",0x47,1,_stderr);
  fwrite("         -C            (CF broadcast mode - no wait for flow controls)\n",0x47,1,_stderr);
  fwrite("         -L <mtu>:<tx_dl>:<tx_flags>  (link layer options for CAN FD)\n",0x46,1,_stderr);
  fwrite("\nCAN IDs and addresses are given and expected in hexadecimal values.\n",0x45,1,_stderr);
  fwrite("The pdu data is expected on STDIN in space separated ASCII hex values.\n",0x47,1,_stderr);
  fprintf(_stderr,"(*) = Use \'-t %s\' to set N_As to zero for Linux version 5.18+\n","ZERO");
  fputc(10,_stderr);
  return;
}

Assistant:

void print_usage(char *prg)
{
	fprintf(stderr, "\nUsage: %s [options] <CAN interface>\n", prg);
	fprintf(stderr, "Options:\n");
	fprintf(stderr, "         -s <can_id>  (source can_id. Use 8 digits for extended IDs)\n");
	fprintf(stderr, "         -d <can_id>  (destination can_id. Use 8 digits for extended IDs)\n");
	fprintf(stderr, "         -x <addr>[:<rxaddr>]  (extended addressing / opt. separate rxaddr)\n");
	fprintf(stderr, "         -p [tx]:[rx]  (set and enable tx/rx padding bytes)\n");
	fprintf(stderr, "         -P <mode>     (check rx padding for (l)ength (c)ontent (a)ll)\n");
	fprintf(stderr, "         -t <time ns>  (frame transmit time (N_As) in nanosecs) (*)\n");
	fprintf(stderr, "         -f <time ns>  (ignore FC and force local tx stmin value in nanosecs)\n");
	fprintf(stderr, "         -D <len>      (send a fixed PDU with len bytes - no STDIN data)\n");
	fprintf(stderr, "         -l <num>      (send num PDUs - use 'i' for infinite loop)\n");
	fprintf(stderr, "         -g <usecs>    (wait given usecs before sending a PDU)\n");
	fprintf(stderr, "         -b            (block until the PDU transmission is completed)\n");
	fprintf(stderr, "         -S            (SF broadcast mode - for functional addressing)\n");
	fprintf(stderr, "         -C            (CF broadcast mode - no wait for flow controls)\n");
	fprintf(stderr, "         -L <mtu>:<tx_dl>:<tx_flags>  (link layer options for CAN FD)\n");
	fprintf(stderr, "\nCAN IDs and addresses are given and expected in hexadecimal values.\n");
	fprintf(stderr, "The pdu data is expected on STDIN in space separated ASCII hex values.\n");
	fprintf(stderr, "(*) = Use '-t %s' to set N_As to zero for Linux version 5.18+\n", ZERO_STRING);
	fprintf(stderr, "\n");
}